

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

ON__UINT16 __thiscall
ON_Outline::Internal_AppendFigure
          (ON_Outline *this,size_t point_count_as_size_t,ON_OutlineFigurePoint *points,
          double short_tolerance,bool bSkipPointFigures)

{
  Proximity PVar1;
  ON__UINT16 OVar2;
  float fVar3;
  bool bVar4;
  Type TVar5;
  bool bVar6;
  Type TVar7;
  uint uVar8;
  undefined7 extraout_var;
  ulong uVar9;
  ON_OutlineFigurePoint *pOVar10;
  ON_OutlineFigure *pOVar11;
  ulong uVar12;
  char *sFormat;
  ulong uVar13;
  ON_OutlineFigurePoint *extraout_RDX;
  ON_OutlineFigurePoint *extraout_RDX_00;
  ON_OutlineFigurePoint *extraout_RDX_01;
  ON_OutlineFigurePoint *extraout_RDX_02;
  ON_OutlineFigurePoint *pOVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ON_OutlineFigurePoint *pOVar22;
  uint i;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint prev_figure_end;
  ON_OutlineFigurePoint prev_figure_start;
  ON_OutlineFigurePoint local_b8;
  ulong local_a8;
  ON_OutlineFigurePoint local_a0;
  ON_OutlineFigure *local_90;
  ulong local_88;
  undefined4 local_7c;
  ON_OutlineFigurePoint local_78;
  ON_OutlineFigurePoint local_68;
  long local_58;
  ON_SimpleArray<ON_OutlineFigurePoint> *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (point_count_as_size_t == 0) {
    return 0;
  }
  uVar16 = (uint)point_count_as_size_t;
  if (uVar16 < 2 || points == (ON_OutlineFigurePoint *)0x0) {
    sFormat = "Invalid point_count or points[] array.";
    iVar19 = 0x59c;
LAB_0049603a:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,iVar19,"",sFormat);
    return 0;
  }
  local_b8.m_point.y = (points->m_point).y;
  local_b8.m_point_type = points->m_point_type;
  local_b8.m_point_proximity = points->m_point_proximity;
  local_b8.m_figure_index = points->m_figure_index;
  local_b8.m_point.x = (points->m_point).x;
  bVar4 = ON_OutlineFigurePoint::IsBeginFigurePoint(&local_b8);
  if (((!bVar4) || (bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_b8), !bVar4)) ||
     (bVar4 = ON_2fPoint::IsValid(&local_b8.m_point), !bVar4)) {
    sFormat = "points[0] is not a valid BeginFigure point.";
    iVar19 = 0x5a7;
    goto LAB_0049603a;
  }
  uVar20 = (ulong)(uVar16 - 1);
  local_a0.m_point.y = points[uVar20].m_point.y;
  pOVar22 = points + uVar20;
  local_a0.m_point_type = pOVar22->m_point_type;
  local_a0.m_point_proximity = pOVar22->m_point_proximity;
  local_a0.m_figure_index = pOVar22->m_figure_index;
  local_a0.m_point.x = (pOVar22->m_point).x;
  bVar4 = ON_OutlineFigurePoint::IsEndFigurePoint(&local_a0);
  if (((!bVar4) || (bVar4 = ON_OutlineFigurePoint::IsOnFigure(&local_a0), !bVar4)) ||
     (bVar4 = ON_2fPoint::IsValid(&local_a0.m_point), !bVar4)) {
    sFormat = "points[point_count-1] is not a valid EndFigure point.";
    iVar19 = 0x5b2;
    goto LAB_0049603a;
  }
  if ((bSkipPointFigures && uVar16 == 2) &&
     (bVar4 = ON_2fPoint::operator==(&local_b8.m_point,&local_a0.m_point), bVar4)) {
    return 0;
  }
  local_7c = 0;
  if ((2 < uVar16) && (this->m_figure_type == DoubleStroke)) {
    TVar5 = ON_OutlineFigurePoint::PointType(&local_b8);
    if ((TVar5 == BeginFigureClosed) &&
       (TVar5 = ON_OutlineFigurePoint::PointType(&local_a0), TVar5 == EndFigureClosed)) {
      bVar4 = ON_2fPoint::operator==(&local_b8.m_point,&local_a0.m_point);
      local_7c = (undefined4)CONCAT71(extraout_var,bVar4);
    }
    else {
      local_7c = 0;
    }
  }
  if (((char)local_7c == '\x01' && 3 < uVar16) && (iVar19 = (this->m_figures).m_count, iVar19 != 0))
  {
    uVar8 = iVar19 - 1;
    pOVar11 = (this->m_figures).m_a;
    uVar12 = 1;
    uVar15 = uVar20;
    if ((pOVar11[uVar8].m_figure_type == DoubleStroke) &&
       (pOVar11 = pOVar11 + uVar8, (pOVar11->m_points).m_count == uVar16)) {
      pOVar22 = (pOVar11->m_points).m_a;
      local_68.m_point.y = (pOVar22->m_point).y;
      local_68._0_8_ = *(undefined8 *)pOVar22;
      pOVar22 = (pOVar11->m_points).m_a;
      local_78.m_point.y = pOVar22[uVar20].m_point.y;
      pOVar22 = pOVar22 + uVar20;
      local_78.m_point_type = pOVar22->m_point_type;
      local_78.m_point_proximity = pOVar22->m_point_proximity;
      local_78.m_figure_index = pOVar22->m_figure_index;
      local_78.m_point.x = (pOVar22->m_point).x;
      TVar5 = ON_OutlineFigurePoint::PointType(&local_68);
      uVar12 = 1;
      if (TVar5 == BeginFigureClosed) {
        TVar5 = ON_OutlineFigurePoint::PointType(&local_78);
        if ((TVar5 == EndFigureClosed) &&
           (local_90 = pOVar11,
           bVar4 = ON_2fPoint::operator==((ON_2fPoint *)((long)&local_68 + 4),&local_b8.m_point),
           bVar4)) {
          bVar4 = ON_2fPoint::operator==(&local_78.m_point,&local_b8.m_point);
          uVar12 = 1;
          if (bVar4) {
            local_50 = &local_90->m_points;
            local_38 = point_count_as_size_t & 0xffffffff;
            local_40 = point_count_as_size_t - 1;
            uVar12 = 0;
            local_58 = (ulong)(uVar16 - 2) * 3;
            local_88 = 0;
            do {
              uVar13 = 0;
              uVar9 = local_40;
              pOVar22 = points;
              local_48 = uVar12;
              do {
                uVar12 = uVar9;
                if ((int)local_88 == 0) {
                  uVar12 = uVar13;
                }
                pOVar14 = (local_90->m_points).m_a + (uVar12 & 0xffffffff);
                bVar4 = ON_OutlineFigurePoint::IsOnFigure(pOVar14);
                local_a8 = CONCAT71(local_a8._1_7_,bVar4);
                bVar4 = ON_OutlineFigurePoint::IsOnFigure(pOVar22);
                if ((bool)(Type)local_a8 == bVar4) {
LAB_0049623b:
                  bVar4 = ON_2fPoint::operator==(&pOVar14->m_point,&pOVar22->m_point);
                  pOVar14 = extraout_RDX_00;
                }
                else {
                  TVar5 = ON_OutlineFigurePoint::PointType(pOVar14);
                  local_a8 = CONCAT71(local_a8._1_7_,TVar5);
                  TVar5 = ON_OutlineFigurePoint::PointType(pOVar22);
                  if ((Type)local_a8 == TVar5) goto LAB_0049623b;
                  bVar4 = false;
                  pOVar14 = extraout_RDX;
                }
                pOVar11 = local_90;
                if (bVar4 == false) break;
                uVar13 = uVar13 + 1;
                uVar9 = uVar9 - 1;
                pOVar22 = pOVar22 + 1;
              } while (uVar13 < local_38);
              if (bVar4 != false) {
                pOVar22 = (local_90->m_points).m_a;
                pOVar22->m_point_type = BeginFigureOpen;
                bVar6 = ON_OutlineFigurePoint::IsOnFigure
                                  ((ON_OutlineFigurePoint *)(&pOVar22->m_point_type + local_58 * 4))
                ;
                pOVar14 = extraout_RDX_01;
                if ((bVar6) &&
                   (bVar6 = ON_2fPoint::operator==
                                      (&local_78.m_point,
                                       (ON_2fPoint *)
                                       (&(((pOVar11->m_points).m_a)->m_point).x + local_58)),
                   pOVar14 = extraout_RDX_02, !bVar6)) {
                  pOVar10 = ON_SimpleArray<ON_OutlineFigurePoint>::AppendNew(local_50);
                  uVar8 = (pOVar11->m_points).m_count - 2;
                  pOVar14 = (pOVar11->m_points).m_a;
                  pOVar14[uVar8].m_point_type = LineTo;
                  pOVar22 = pOVar14 + uVar8;
                  PVar1 = pOVar22->m_point_proximity;
                  OVar2 = pOVar22->m_figure_index;
                  fVar3 = (pOVar22->m_point).x;
                  pOVar10->m_point_type = pOVar22->m_point_type;
                  pOVar10->m_point_proximity = PVar1;
                  pOVar10->m_figure_index = OVar2;
                  (pOVar10->m_point).x = fVar3;
                  (pOVar10->m_point).y = pOVar14[uVar8].m_point.y;
                  pOVar10->m_point_type = EndFigureOpen;
                }
                pOVar11->m_figure_type = SingleStroke;
                uVar15 = (ulong)pOVar11->m_figure_index;
              }
              uVar12 = local_48;
              if (bVar4 != false) break;
              iVar19 = (int)local_88;
              local_88 = (ulong)(iVar19 + 1);
              uVar12 = CONCAT71((int7)((ulong)pOVar14 >> 8),iVar19 != 0);
            } while (iVar19 == 0);
          }
        }
        else {
          uVar12 = 1;
        }
      }
    }
    if ((uVar12 & 1) == 0) {
      return (ON__UINT16)uVar15;
    }
  }
  pOVar11 = ON_ClassArray<ON_OutlineFigure>::AppendNew(&this->m_figures);
  pOVar11->m_figure_index = (ON__UINT16)(this->m_figures).m_count;
  pOVar11->m_short_tolerance =
       (double)(~-(ulong)(0.0 < short_tolerance) & (ulong)this->m_short_tolerance |
               (ulong)short_tolerance & -(ulong)(0.0 < short_tolerance));
  ON_SimpleArray<ON_OutlineFigurePoint>::Append(&pOVar11->m_points,uVar16,points);
  pOVar22 = (pOVar11->m_points).m_a;
  (pOVar22->m_point).y = local_b8.m_point.y;
  pOVar22->m_point_type = local_b8.m_point_type;
  pOVar22->m_point_proximity = local_b8.m_point_proximity;
  pOVar22->m_figure_index = local_b8.m_figure_index;
  (pOVar22->m_point).x = local_b8.m_point.x;
  pOVar11->m_figure_type = this->m_figure_type;
  pOVar11->m_units_per_em = this->m_units_per_em;
  if ((char)local_7c == '\0') goto LAB_0049673c;
  local_68._0_8_ = ON_2fPoint::NanPoint;
  uVar8 = uVar16 - 3;
  if (uVar8 == 0) {
LAB_004964de:
    bVar4 = false;
  }
  else {
    bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar8);
    if (bVar4) {
LAB_00496439:
      bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar8);
      if (!bVar4) goto LAB_004964de;
      bVar4 = ON_2fPoint::operator==(&(pOVar11->m_points).m_a[uVar8].m_point,&local_b8.m_point);
      if (bVar4) {
        uVar18 = uVar16 - 2;
        bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar18);
        if ((!bVar4) ||
           (TVar5 = ON_OutlineFigurePoint::PointType((pOVar11->m_points).m_a + uVar18),
           TVar5 != LineTo)) goto LAB_004964de;
        local_68._0_8_ = (pOVar11->m_points).m_a[uVar18].m_point;
        bVar4 = ON_2fPoint::operator==((ON_2fPoint *)&local_68,&local_a0.m_point);
        bVar4 = !bVar4;
        uVar20 = (ulong)uVar8;
      }
      else {
        bVar4 = false;
      }
    }
    else {
      uVar12 = (ulong)(uVar16 - 2);
      local_a8 = uVar12;
      bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar12);
      if ((!bVar4) ||
         (bVar4 = ON_2fPoint::operator==(&(pOVar11->m_points).m_a[uVar12].m_point,&local_a0.m_point)
         , !bVar4)) goto LAB_00496439;
      bVar4 = false;
      uVar20 = local_a8;
    }
  }
  if ((uVar20 & 1) == 0 && (int)uVar20 != 0) {
    uVar8 = 0;
    do {
      pOVar22 = (pOVar11->m_points).m_a;
      bVar6 = ON_2fPoint::operator==(&pOVar22[uVar8].m_point,&pOVar22[uVar20 & 0xffffffff].m_point);
      if (((!bVar6) ||
          (bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar8), !bVar6)) ||
         (bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + (uVar20 & 0xffffffff))
         , !bVar6)) break;
      uVar15 = (ulong)(uVar8 + 1);
      lVar17 = uVar15 * 0xc;
      uVar12 = (ulong)((int)uVar20 - 1);
      lVar21 = uVar12 * 0xc;
      do {
        uVar20 = uVar12;
        uVar8 = (uint)uVar15;
        uVar18 = (uint)uVar20;
        if (((uVar18 <= uVar8) ||
            (bVar6 = ON_OutlineFigurePoint::IsOnFigure
                               ((ON_OutlineFigurePoint *)
                                (&((pOVar11->m_points).m_a)->m_point_type + lVar17)), bVar6)) ||
           (bVar6 = ON_OutlineFigurePoint::IsOnFigure
                              ((ON_OutlineFigurePoint *)
                               (&((pOVar11->m_points).m_a)->m_point_type + lVar21)), bVar6)) break;
        TVar5 = ON_OutlineFigurePoint::PointType
                          ((ON_OutlineFigurePoint *)
                           (&((pOVar11->m_points).m_a)->m_point_type + lVar17));
        TVar7 = ON_OutlineFigurePoint::PointType
                          ((ON_OutlineFigurePoint *)
                           (&((pOVar11->m_points).m_a)->m_point_type + lVar21));
        if (TVar5 != TVar7) break;
        pOVar22 = (pOVar11->m_points).m_a;
        bVar6 = ON_2fPoint::operator==
                          ((ON_2fPoint *)((long)&(pOVar22->m_point).x + lVar17),
                           (ON_2fPoint *)((long)&(pOVar22->m_point).x + lVar21));
        uVar15 = (ulong)(uVar8 + 1);
        lVar17 = lVar17 + 0xc;
        lVar21 = lVar21 + -0xc;
        uVar12 = (ulong)(uVar18 - 1);
      } while (bVar6);
    } while (uVar8 < uVar18);
    uVar18 = (uint)uVar20;
    if (uVar8 == uVar18) {
      bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + (uVar20 & 0xffffffff));
      if (((bVar6) &&
          (bVar6 = ON_OutlineFigurePoint::IsEndFigurePoint
                             ((pOVar11->m_points).m_a + (uVar20 & 0xffffffff)), !bVar6)) &&
         (uVar18 + 2 <= uVar16)) {
        if (bVar4) {
          if (uVar16 < uVar18 + 3) goto LAB_0049673c;
          uVar18 = uVar18 + 1;
          uVar20 = (ulong)uVar18;
          if (uVar18 != 0) {
            lVar17 = (ulong)uVar18 * 0xc;
            do {
              pOVar22 = (pOVar11->m_points).m_a;
              *(undefined4 *)((long)&(pOVar22->m_point).y + lVar17) =
                   *(undefined4 *)((long)pOVar22 + lVar17 + -4);
              *(undefined8 *)(&pOVar22->m_point_type + lVar17) =
                   *(undefined8 *)(&pOVar22[-1].m_point_type + lVar17);
              lVar17 = lVar17 + -0xc;
            } while (lVar17 != 0);
          }
          ((pOVar11->m_points).m_a)->m_point = (ON_2fPoint)local_68._0_8_;
          (pOVar11->m_points).m_a[1].m_point_type = LineTo;
        }
        pOVar22 = (pOVar11->m_points).m_a;
        pOVar22->m_point_type = BeginFigureOpen;
        uVar16 = (int)uVar20 + 1;
        pOVar22[uVar16].m_point = pOVar22[uVar20 & 0xffffffff].m_point;
        pOVar22 = (pOVar11->m_points).m_a + uVar16;
        pOVar22->m_point_type = EndFigureOpen;
        pOVar22->m_point_proximity = OnFigure;
        pOVar11->m_figure_type = SingleStroke;
        iVar19 = (int)uVar20 + 2;
        if ((-1 < iVar19) && (iVar19 <= (pOVar11->m_points).m_capacity)) {
          (pOVar11->m_points).m_count = iVar19;
        }
      }
    }
  }
LAB_0049673c:
  this->m_sorted_figure_outer_orientation = Unset;
  return pOVar11->m_figure_index;
}

Assistant:

ON__UINT16 ON_Outline::Internal_AppendFigure(
  size_t point_count_as_size_t,
  const ON_OutlineFigurePoint* points,
  double short_tolerance,
  bool bSkipPointFigures
)
{
  if (0 == point_count_as_size_t)
    return 0;
  
  const unsigned int point_count = (unsigned int)point_count_as_size_t;

  if (point_count < 2 || nullptr == points)
  {
    ON_ERROR("Invalid point_count or points[] array.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_start = points[0];
  if (
    false == figure_start.IsBeginFigurePoint()
    || false == figure_start.IsOnFigure()
    || false == figure_start.m_point.IsValid()
    )
  {
    ON_ERROR("points[0] is not a valid BeginFigure point.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_end = points[point_count-1];
  if (
    false == figure_end.IsEndFigurePoint()
    || false == figure_end.IsOnFigure()
    || false == figure_end.m_point.IsValid()
    )
  {
    ON_ERROR("points[point_count-1] is not a valid EndFigure point.");
    return 0;
  }

  if (bSkipPointFigures && 2 == point_count && figure_start.m_point == figure_end.m_point)
    return 0;

  const bool bDoubleStrokeReductionTest
    = ON_OutlineFigure::Type::DoubleStroke == m_figure_type
    && point_count >= 3
    && ON_OutlineFigurePoint::Type::BeginFigureClosed == figure_start.PointType()
    && ON_OutlineFigurePoint::Type::EndFigureClosed == figure_end.PointType()
    && figure_start.m_point == figure_end.m_point;

  while (
    bDoubleStrokeReductionTest
    && point_count >= 4
    && m_figures.UnsignedCount() > 0
    )
  {
    ON_OutlineFigure& prev_figure = m_figures[m_figures.UnsignedCount() - 1];
    if (ON_OutlineFigure::Type::DoubleStroke != prev_figure.m_figure_type)
      break;
    if (point_count != (prev_figure.m_points.UnsignedCount()))
      break;
    const ON_OutlineFigurePoint prev_figure_start = prev_figure.m_points[0];
    const ON_OutlineFigurePoint prev_figure_end = prev_figure.m_points[point_count-1];
    if (ON_OutlineFigurePoint::Type::BeginFigureClosed != prev_figure_start.PointType())
      break;
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != prev_figure_end.PointType())
      break;
    if (false == (prev_figure_start.m_point == figure_start.m_point) )
      break;
    if (false == (prev_figure_end.m_point == figure_start.m_point) )
      break;

    for (int dup_check_pass = 0; dup_check_pass < 2; dup_check_pass++)
    {
      bool bDuplicateLoop = true;
      for (unsigned int i = 0; i < point_count; i++)
      {
        const unsigned int j = (0 == dup_check_pass) ? i : (point_count - i - 1);
        const ON_OutlineFigurePoint& prev_point = prev_figure.m_points[j];
        bDuplicateLoop
          = (prev_point.IsOnFigure() == points[i].IsOnFigure() || prev_point.PointType() == points[i].PointType())
          && prev_point.m_point == points[i].m_point;
        if (false == bDuplicateLoop)
          break;
      }
      if (false == bDuplicateLoop)
        continue;

      // This figure is the double stroke duplicate of the previous figure (double stroke glphys like O).
      prev_figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
      if (
        prev_figure.m_points[point_count - 2].IsOnFigure()
        && false == (prev_figure_end.m_point == prev_figure.m_points[point_count - 2].m_point)
        )
      {
        ON_OutlineFigurePoint& new_figure_end = prev_figure.m_points.AppendNew();
        ON_OutlineFigurePoint& p = prev_figure.m_points[prev_figure.m_points.UnsignedCount() - 2];
        p.m_point_type = ON_OutlineFigurePoint::Type::LineTo;
        new_figure_end = p;
        new_figure_end.m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
      }
      prev_figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
      return prev_figure.FigureIndex();
    }
    break;
  }
  
  ON_OutlineFigure& figure = m_figures.AppendNew();
  figure.m_figure_index = (ON__UINT16)m_figures.UnsignedCount();
  figure.m_short_tolerance = (short_tolerance>0.0) ? short_tolerance : m_short_tolerance;
  figure.m_points.Append((int)point_count, points);
  figure.m_points[0] = figure_start;
  figure.m_figure_type = m_figure_type;
  figure.m_units_per_em = this->m_units_per_em;

  while (bDoubleStrokeReductionTest)
  {
    // check for a double stroke figure like those in CamBam Stick fonts
    unsigned int i0 = 0;

    ON_2fPoint Qpoint(ON_2fPoint::NanPoint);
    bool bPrependQseg = false;
    unsigned int i1 = (unsigned int)(point_count - 1);
    if (i1 - 2 > 0)
    {
      if (
        false == figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 1].IsOnFigure()
        && figure.m_points[i1 - 1].m_point == figure_end.m_point
        )
      {
        i1--;
      }
      else if (
        figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 2].m_point == figure_start.m_point
        && figure.m_points[i1 - 1].IsOnFigure()
        && ON_OutlineFigurePoint::Type::LineTo == figure.m_points[i1 - 1].PointType()
        )
      {
        Qpoint = figure.m_points[i1 - 1].m_point;
        if (false == (Qpoint == figure_end.m_point))
          bPrependQseg = true;
        i1 -= 2;
      }
    }
   
    if (i0 >= i1)
      break;

    if (0 != (i1 - i0) % 2)
      break;

    while (i0 < i1)
    {
      if (false == (figure.m_points[i0].m_point == figure.m_points[i1].m_point))
        break;
      if (false == figure.m_points[i0].IsOnFigure() || false == figure.m_points[i1].IsOnFigure())
        break;
      i0++;
      i1--;
      while (
        i0 < i1
        && false == figure.m_points[i0].IsOnFigure()
        && false == figure.m_points[i1].IsOnFigure()
        && figure.m_points[i0].PointType() == figure.m_points[i1].PointType()
        && figure.m_points[i0].m_point == figure.m_points[i1].m_point
        )
      {
        i0++;
        i1--;
      }
    }
    if (i0 != i1)
      break;
    if (false == figure.m_points[i1].IsOnFigure())
      break;
    if (figure.m_points[i1].IsEndFigurePoint())
      break;
    if ((size_t)(i1 + 2) > point_count)
      break;

    if ( bPrependQseg )
    {
      if ((i1 + 3) > point_count)
        break;
      for (unsigned int i = i1 + 1; i > 0; i--)
        figure.m_points[i] = figure.m_points[i - 1];
      figure.m_points[0].m_point = Qpoint;
      figure.m_points[1].m_point_type = ON_OutlineFigurePoint::Type::LineTo;
      i1++;
    }
    figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
    figure.m_points[i1 + 1].m_point = figure.m_points[i1].m_point;
    figure.m_points[i1 + 1].m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
    figure.m_points[i1 + 1].m_point_proximity = ON_OutlineFigurePoint::Proximity::OnFigure;
    figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
    figure.m_points.SetCount(i1 + 2);

    break;
  }

  m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Unset;
  return figure.m_figure_index;
}